

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcWriteVer.c
# Opt level: O1

void Wlc_WriteAddPos(Wlc_Ntk_t *p)

{
  uint uVar1;
  Wlc_Obj_t *pWVar2;
  Wlc_Obj_t *pWVar3;
  int *piVar4;
  ushort uVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  
  (p->vPos).nSize = 0;
  if (1 < p->iObj) {
    lVar7 = 1;
    lVar8 = 0x18;
    do {
      if (p->nObjsAlloc <= lVar7) {
        __assert_fail("Id > 0 && Id < p->nObjsAlloc",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlc.h"
                      ,0x11a,"Wlc_Obj_t *Wlc_NtkObj(Wlc_Ntk_t *, int)");
      }
      pWVar2 = p->pObjs;
      uVar5 = *(ushort *)(&pWVar2->field_0x0 + lVar8) & 0x3f;
      if ((uVar5 != 1) && (uVar5 != 8)) {
        *(ushort *)(&pWVar2->field_0x0 + lVar8) = *(ushort *)(&pWVar2->field_0x0 + lVar8) | 0x200;
        pWVar3 = p->pObjs;
        uVar1 = (p->vPos).nCap;
        if ((p->vPos).nSize == uVar1) {
          if ((int)uVar1 < 0x10) {
            piVar4 = (p->vPos).pArray;
            if (piVar4 == (int *)0x0) {
              piVar4 = (int *)malloc(0x40);
            }
            else {
              piVar4 = (int *)realloc(piVar4,0x40);
            }
            (p->vPos).pArray = piVar4;
            iVar6 = 0x10;
          }
          else {
            iVar6 = uVar1 * 2;
            if (iVar6 <= (int)uVar1) goto LAB_0037e7b5;
            piVar4 = (p->vPos).pArray;
            if (piVar4 == (int *)0x0) {
              piVar4 = (int *)malloc((ulong)uVar1 << 3);
            }
            else {
              piVar4 = (int *)realloc(piVar4,(ulong)uVar1 << 3);
            }
            (p->vPos).pArray = piVar4;
          }
          if (piVar4 == (int *)0x0) {
            __assert_fail("p->pArray",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                          ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
          }
          (p->vPos).nCap = iVar6;
        }
LAB_0037e7b5:
        iVar6 = (p->vPos).nSize;
        (p->vPos).nSize = iVar6 + 1;
        (p->vPos).pArray[iVar6] =
             (int)((ulong)((long)pWVar2 + (lVar8 - (long)pWVar3)) >> 3) * -0x55555555;
      }
      lVar7 = lVar7 + 1;
      lVar8 = lVar8 + 0x18;
    } while (lVar7 < p->iObj);
  }
  return;
}

Assistant:

void Wlc_WriteAddPos( Wlc_Ntk_t * p )
{
    Wlc_Obj_t * pObj;
    int i;
    Vec_IntClear( &p->vPos );
    Wlc_NtkForEachObj( p, pObj, i )
        if ( pObj->Type != WLC_OBJ_PI && pObj->Type != WLC_OBJ_MUX )
        {
            pObj->fIsPo = 1;
            Vec_IntPush( &p->vPos, Wlc_ObjId(p, pObj) );
        }
}